

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O0

void __thiscall
ot::commissioner::CommissionerSafe::PushAsyncRequest
          (CommissionerSafe *this,AsyncRequest *aAsyncRequest)

{
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> _;
  AsyncRequest *aAsyncRequest_local;
  CommissionerSafe *this_local;
  
  _._M_device = (mutex_type *)aAsyncRequest;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->mInvokeMutex);
  std::
  queue<std::function<void()>,std::deque<std::function<void()>,std::allocator<std::function<void()>>>>
  ::emplace<std::function<void()>>
            ((queue<std::function<void()>,std::deque<std::function<void()>,std::allocator<std::function<void()>>>>
              *)&this->mAsyncRequestQueue,(function<void_()> *)_._M_device);
  event_active(&this->mInvokeEvent,0,0);
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return;
}

Assistant:

void CommissionerSafe::PushAsyncRequest(AsyncRequest &&aAsyncRequest)
{
    std::lock_guard<std::mutex> _(mInvokeMutex);

    mAsyncRequestQueue.emplace(std::move(aAsyncRequest));

    // Notify for new async request
    event_active(&mInvokeEvent, 0, 0);
}